

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O1

void __thiscall
tchecker::clock_updates_visitor_t::visit
          (clock_updates_visitor_t *this,typed_sum_to_clock_assign_statement_t *stmt)

{
  size_t sVar1;
  typed_lvalue_expression_t *x;
  typed_lvalue_expression_t *y;
  long *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  shared_ptr<const_tchecker::expression_t> local_38;
  
  sVar1 = this->_loop_depth;
  x = typed_sum_to_clock_assign_statement_t::lclock(stmt);
  y = typed_sum_to_clock_assign_statement_t::rclock(stmt);
  if (sVar1 == 0) {
    typed_sum_to_clock_assign_statement_t::value_ptr
              ((typed_sum_to_clock_assign_statement_t *)&local_48);
    if (local_48 == (long *)0x0) {
      local_38.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      local_38.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((long)local_48 + *(long *)(*local_48 + -0x38));
    }
    local_38.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Stack_40;
    local_48 = (long *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    update_sum_to_clock_outside_loop(this,x,y,&local_38);
  }
  else {
    typed_sum_to_clock_assign_statement_t::value_ptr
              ((typed_sum_to_clock_assign_statement_t *)&local_48);
    if (local_48 == (long *)0x0) {
      local_38.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      local_38.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((long)local_48 + *(long *)(*local_48 + -0x38));
    }
    local_38.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Stack_40;
    local_48 = (long *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    update_sum_to_clock_inside_loop(this,x,y,&local_38);
  }
  if (local_38.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  return;
}

Assistant:

virtual void visit(tchecker::typed_sum_to_clock_assign_statement_t const & stmt)
  {
    if (in_loop())
      update_sum_to_clock_inside_loop(stmt.lclock(), stmt.rclock(), stmt.value_ptr());
    else
      update_sum_to_clock_outside_loop(stmt.lclock(), stmt.rclock(), stmt.value_ptr());
  }